

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseCommaExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  size_t sVar4;
  _Bool _Var5;
  int iVar6;
  sysbvm_tuple_t sVar7;
  sysbvm_tuple_t sVar8;
  sysbvm_parser_state_t savedState;
  
  startIndex = state->tokenPosition;
  sVar7 = sysbvm_parser_parseAssignmentExpression(context,state);
  iVar6 = sysbvm_parser_lookKindAt(state,0);
  if (iVar6 != 0x17) {
    return sVar7;
  }
  sVar8 = sysbvm_orderedCollection_create(context);
  do {
    sysbvm_orderedCollection_add(context,sVar8,sVar7);
    iVar6 = sysbvm_parser_lookKindAt(state,0);
    if (iVar6 != 0x17) goto LAB_0012f3c3;
    state->tokenPosition = state->tokenPosition + 1;
    sVar1 = state->sourceCode;
    sVar2 = state->tokenSequence;
    sVar3 = state->tokenPosition;
    sVar4 = state->tokenSequenceSize;
    sVar7 = sysbvm_parser_parseAssignmentExpression(context,state);
  } while ((sVar7 != 0) && (_Var5 = sysbvm_astNode_isErrorNode(context,sVar7), !_Var5));
  state->tokenPosition = sVar3;
  state->tokenSequenceSize = sVar4;
  state->sourceCode = sVar1;
  state->tokenSequence = sVar2;
LAB_0012f3c3:
  sVar7 = sysbvm_parser_makeSourcePositionForTokenRange
                    (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition)
  ;
  sVar8 = sysbvm_orderedCollection_asArray(context,sVar8);
  sVar7 = sysbvm_astMakeArrayNode_create(context,sVar7,sVar8);
  return sVar7;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseCommaExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    size_t startPosition = state->tokenPosition;
    sysbvm_tuple_t firstElement = sysbvm_parser_parseCommaExpressionElement(context, state);
    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COMMA)
    {
        sysbvm_tuple_t elements = sysbvm_orderedCollection_create(context);
        sysbvm_orderedCollection_add(context, elements, firstElement);

        while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COMMA)
        {
            ++state->tokenPosition;
            sysbvm_parser_state_t savedState = *state;
            sysbvm_tuple_t nextElement = sysbvm_parser_parseCommaExpressionElement(context, state);
            if(!nextElement || sysbvm_astNode_isErrorNode(context, nextElement))
            {
                *state = savedState;
                break;
            }
            sysbvm_orderedCollection_add(context, elements, nextElement);
        }

        size_t endPosition = state->tokenPosition;
        return sysbvm_astMakeArrayNode_create(context,
            sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition),
            sysbvm_orderedCollection_asArray(context, elements));
    }
    else
    {
        return firstElement;
    }
}